

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  TokenKind TVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  Token *pTVar4;
  Node *pNVar5;
  Token TStack_48;
  
  if (this->Key != (Node *)0x0) {
    return this->Key;
  }
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  TVar1 = pTVar4->Kind;
  if ((int)TVar1 < 0x10) {
    if ((TVar1 != TK_Error) && (TVar1 != TK_BlockEnd)) {
LAB_0016c37a:
      pTVar4 = Scanner::peekNext(*(Scanner **)
                                  &((((this->super_Node).Doc)->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->stream->scanner);
      if ((pTVar4->Kind != TK_Value) && (pTVar4->Kind != TK_BlockEnd)) {
        pNVar5 = Document::parseBlockNode
                           ((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
        goto LAB_0016c3fa;
      }
    }
  }
  else if (TVar1 != TK_Value) {
    if ((TVar1 == TK_Key) &&
       (Scanner::getNext(&TStack_48,
                         *(Scanner **)
                          &((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)TStack_48.Value._M_dataplus._M_p != &TStack_48.Value.field_2)) {
      operator_delete(TStack_48.Value._M_dataplus._M_p,
                      TStack_48.Value.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0016c37a;
  }
  pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->NodeAllocator,0x48,0x10);
  puVar2 = (this->super_Node).Doc;
  pNVar5->Doc = puVar2;
  pNVar5->TypeID = 0;
  (pNVar5->Tag).Data = (char *)0x0;
  (pNVar5->Tag).Length = 0;
  (pNVar5->Anchor).Data = (char *)0x0;
  (pNVar5->Anchor).Length = 0;
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((puVar2->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar3 = (pTVar4->Range).Data;
  (pNVar5->SourceRange).Start.Ptr = pcVar3;
  (pNVar5->SourceRange).End.Ptr = pcVar3;
  pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e10d0;
LAB_0016c3fa:
  this->Key = pNVar5;
  return pNVar5;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}